

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void vrna_md_set_default(vrna_md_t *md)

{
  if (md != (vrna_md_t *)0x0) {
    vrna_md_copy(md,&defaults);
    return;
  }
  return;
}

Assistant:

PUBLIC void
vrna_md_set_default(vrna_md_t *md)
{
  if (md) /* copy defaults */
    vrna_md_copy(md, &defaults);
}